

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_PlaySpawnSound
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *spawner;
  bool bVar1;
  bool local_51;
  AActor *local_50;
  bool local_43;
  AActor *missile;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18f6,
                  "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18f6,
                  "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  spawner = (AActor *)(param->field_0).field_1.a;
  local_43 = true;
  if (spawner != (AActor *)0x0) {
    local_43 = DObject::IsKindOf((DObject *)spawner,AActor::RegistrationInfo.MyClass);
  }
  if (local_43 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18f6,
                  "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18f7,
                  "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
    bVar1 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar1) {
    if (param[1].field_0.field_1.a == (void *)0x0) {
      NullParam("\"missile\"");
      local_50 = (AActor *)param[1].field_0.field_1.a;
    }
    else {
      local_50 = (AActor *)param[1].field_0.field_1.a;
    }
    local_51 = true;
    if (local_50 != (AActor *)0x0) {
      local_51 = DObject::IsKindOf((DObject *)local_50,AActor::RegistrationInfo.MyClass);
    }
    if (local_51 != false) {
      P_PlaySpawnSound(local_50,spawner);
      return 0;
    }
    __assert_fail("missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18f7,
                  "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x18f7,
                "int AF_AActor_PlaySpawnSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, PlaySpawnSound)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(missile, AActor);
	P_PlaySpawnSound(missile, self);
	return 0;
}